

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explorer.hpp
# Opt level: O2

void explorer::Explore<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>(string *directory)

{
  istream *piVar1;
  int next_level_00;
  int iVar2;
  int next_offset_00;
  initializer_list<uttt::IBoard> __l;
  int next_level;
  int next_offset;
  int offset;
  allocator_type local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  ifstream in;
  int aiStack_200 [122];
  
  next_level = 0;
  offset = 0;
  next_offset = 0;
  std::operator+(&local_240,directory,'/');
  std::operator+(&local_260,&local_240,"levels");
  std::ifstream::ifstream(&in,(string *)&local_260,_S_in);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if (*(int *)((long)aiStack_200 + *(long *)(_in + -0x18)) == 0) {
    piVar1 = (istream *)std::istream::operator>>((istream *)&in,&next_level);
    piVar1 = (istream *)std::istream::operator>>(piVar1,&offset);
    std::istream::operator>>(piVar1,&next_offset);
    std::ifstream::~ifstream(&in);
    iVar2 = offset;
    next_offset_00 = next_offset;
    next_level_00 = next_level;
  }
  else {
    std::ifstream::~ifstream(&in);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                   directory,"/0_0");
    uttt::IBoard::IBoard((IBoard *)&local_240);
    __l._M_len = 1;
    __l._M_array = (iterator)&local_240;
    std::vector<uttt::IBoard,_std::allocator<uttt::IBoard>_>::vector
              ((vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)&local_260,__l,&local_261);
    DumpToFile<uttt::IBoard,uttt::IBoardWriter>
              ((string *)&in,(vector<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)&local_260);
    std::_Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_>::~_Vector_base
              ((_Vector_base<uttt::IBoard,_std::allocator<uttt::IBoard>_> *)&local_260);
    std::__cxx11::string::~string((string *)&in);
    offset = 0;
    next_level = 1;
    next_offset = 0;
    WriteLevelsFile(directory,1,0,0);
    iVar2 = 0;
    next_offset_00 = 0;
    next_level_00 = 1;
  }
  ExploreLevel<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>
            (directory,next_level_00,iVar2,next_offset_00);
  iVar2 = next_level;
  do {
    iVar2 = iVar2 + 1;
    ExploreLevel<uttt::IBoard,uttt::IBoardReader,uttt::IBoardWriter,24>(directory,iVar2,0,0);
  } while( true );
}

Assistant:

void
Explore(const std::string &directory)
{
    int next_level = 0, offset = 0, next_offset = 0;
    if (!ReadLevelsFile(directory, next_level, offset, next_offset))
    {
        DumpToFile<IGame, Writer>(directory + "/0_0", {{}});
        next_level = 1, offset = 0, next_offset = 0;
        WriteLevelsFile(directory, next_level, offset, next_offset);
    }

    ExploreLevel<IGame, Reader, Writer, Size>(directory, next_level, offset, next_offset);
    for (int level = next_level + 1; ; ++level)
        ExploreLevel<IGame, Reader, Writer, Size>(directory, level, 0, 0);
}